

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O2

void * clDeviceMemAllocINTEL
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  CPointerTracker *pCVar1;
  CLIntercept *this;
  byte bVar2;
  CLdispatchX *pCVar3;
  void *usmPtr;
  _func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr
  *p_Var4;
  time_point end;
  allocator local_a9;
  cl_int *local_a8;
  size_t local_a0;
  cl_mem_properties_intel *newProperties;
  time_point local_90;
  cl_device_id device_local;
  cl_int localErrorCode;
  __int_type local_78;
  string local_70;
  string deviceInfo;
  
  this = g_pIntercept;
  if ((g_pIntercept == (CLIntercept *)0x0) ||
     (local_a0 = size, device_local = device, pCVar3 = CLIntercept::dispatchX(g_pIntercept,context),
     pCVar3->clDeviceMemAllocINTEL ==
     (_func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr *
     )0x0)) {
    return (void *)0x0;
  }
  local_78 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  newProperties = (cl_mem_properties_intel *)0x0;
  deviceInfo._M_dataplus._M_p = (pointer)&deviceInfo.field_2;
  deviceInfo._M_string_length = 0;
  deviceInfo.field_2._M_local_buf[0] = '\0';
  bVar2 = (this->m_Config).CallLogging;
  if ((bool)bVar2 == true) {
    CLIntercept::getDeviceInfoString(this,1,&device_local,&deviceInfo);
    bVar2 = (this->m_Config).CallLogging;
  }
  if ((bVar2 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clDeviceMemAllocINTEL",local_78,(cl_kernel)0x0,
               "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",context,
               deviceInfo._M_dataplus._M_p,properties,local_a0,alignment);
  }
  if ((this->m_Config).RelaxAllocationLimits == true) {
    CLIntercept::usmAllocPropertiesOverride(this,properties,&newProperties);
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00134577:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00134577;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_90.__d.__r = (duration)0;
  }
  else {
    local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  p_Var4 = pCVar3->clDeviceMemAllocINTEL;
  local_a8 = errcode_ret;
  if (newProperties == (cl_mem_properties_intel *)0x0) {
LAB_001345ef:
    usmPtr = (*p_Var4)(context,device_local,properties,local_a0,alignment,local_a8);
  }
  else {
    usmPtr = (*p_Var4)(context,device_local,newProperties,local_a0,alignment,errcode_ret);
    if (usmPtr == (void *)0x0) {
      p_Var4 = pCVar3->clDeviceMemAllocINTEL;
      goto LAB_001345ef;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_78 &&
        (local_78 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      std::__cxx11::string::string((string *)&local_70,"",&local_a9);
      CLIntercept::updateHostTimingStats(this,"clDeviceMemAllocINTEL",&local_70,local_90,end);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  if ((usmPtr != (void *)0x0) &&
     (((((this->m_Config).DumpBuffersBeforeEnqueue != false ||
        ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
       ((this->m_Config).InjectBuffers != false)) ||
      (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))))) {
    CLIntercept::addUSMAllocation(this,usmPtr,local_a0);
  }
  if (newProperties != (cl_mem_properties_intel *)0x0) {
    operator_delete__(newProperties);
  }
  newProperties = (cl_mem_properties_intel *)0x0;
  if ((this->m_Config).ErrorLogging == false) {
    bVar2 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar2 == false) && ((this->m_Config).NoErrors != true)) || (*local_a8 == 0))
    goto LAB_0013473f;
  }
  else {
    if (*local_a8 == 0) goto LAB_0013473f;
    CLIntercept::logError(this,"clDeviceMemAllocINTEL",*local_a8);
    bVar2 = (this->m_Config).ErrorAssert;
  }
  if ((bVar2 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *local_a8 = 0;
  }
LAB_0013473f:
  if ((usmPtr != (void *)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar1 = &(this->m_ObjectTracker).m_Pointers;
    (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar1->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clDeviceMemAllocINTEL",*local_a8,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",usmPtr);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    std::__cxx11::string::string((string *)&local_70,"",&local_a9);
    CLIntercept::chromeCallLoggingExit(this,"clDeviceMemAllocINTEL",&local_70,false,0,local_90,end);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&deviceInfo);
  return usmPtr;
}

Assistant:

CL_API_ENTRY void* CL_API_CALL clDeviceMemAllocINTEL(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clDeviceMemAllocINTEL )
        {
            GET_ENQUEUE_COUNTER();

            cl_mem_properties_intel*    newProperties = NULL;
            void*   retVal = NULL;

            std::string deviceInfo;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
            }
            // TODO: Make properties string.
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",
                context,
                deviceInfo.c_str(),
                properties,
                size,
                alignment );
            USM_ALLOC_OVERRIDE_INIT( properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    newProperties,
                    size,
                    alignment,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    properties,
                    size,
                    alignment,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            ADD_USM_ALLOCATION( retVal, size );
            USM_ALLOC_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_POINTER_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            return retVal;
        }
    }

    return NULL;
}